

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  BVH *bvh;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  vfloat_impl<4> vVar6;
  vfloat_impl<4> vVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  uint uVar21;
  undefined4 uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  QuadMesh *mesh;
  NodeRef root;
  uint uVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  vuint<4> *v;
  long lVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  NodeRef *pNVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar69;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar66 [64];
  float fVar70;
  float fVar87;
  float fVar88;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar89;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar84;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar85;
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  undefined1 auVar114 [48];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar141;
  float fVar147;
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar140 [16];
  float fVar159;
  float fVar169;
  float fVar170;
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar171;
  undefined1 auVar168 [16];
  float fVar172;
  float fVar184;
  float fVar185;
  vint4 ai_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar186;
  undefined1 auVar183 [16];
  float fVar187;
  float fVar197;
  float fVar198;
  vint4 ai_3;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar200;
  float fVar211;
  float fVar212;
  vint4 bi;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar214;
  float fVar224;
  float fVar225;
  vint4 bi_1;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  undefined1 auVar223 [16];
  vint4 bi_3;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar227 [16];
  undefined1 auVar237 [64];
  vint4 bi_2;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar247;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 local_38e8 [8];
  float fStack_38e0;
  float fStack_38dc;
  vuint<4> *v_1;
  undefined1 local_38c8 [8];
  float fStack_38c0;
  float fStack_38bc;
  Precalculations pre;
  undefined1 local_38a8 [8];
  float fStack_38a0;
  float fStack_389c;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  vbool<4> terminated;
  undefined1 local_37d8 [8];
  float fStack_37d0;
  float fStack_37cc;
  undefined1 local_37c8 [8];
  float fStack_37c0;
  float fStack_37bc;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_3708 [8];
  float fStack_3700;
  float fStack_36fc;
  undefined1 local_36f8 [8];
  float fStack_36f0;
  float fStack_36ec;
  undefined1 local_36e8 [8];
  float fStack_36e0;
  float fStack_36dc;
  float local_3698;
  float fStack_3694;
  float fStack_3690;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 extraout_var_02 [56];
  undefined1 auVar228 [16];
  undefined1 auVar246 [64];
  
  uVar20 = mm_lookupmask_ps._248_8_;
  uVar19 = mm_lookupmask_ps._240_8_;
  uVar18 = mm_lookupmask_ps._8_8_;
  uVar17 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar112 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar65 = vpcmpeqd_avx(auVar112,(undefined1  [16])valid_i->field_0);
    auVar90 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar90,5);
    auVar91 = auVar65 & auVar8;
    if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar91[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar65);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar242._8_4_ = 0x7fffffff;
      auVar242._0_8_ = 0x7fffffff7fffffff;
      auVar242._12_4_ = 0x7fffffff;
      auVar246 = ZEXT1664(auVar242);
      auVar65 = vandps_avx(auVar242,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar227._8_4_ = 0x219392ef;
      auVar227._0_8_ = 0x219392ef219392ef;
      auVar227._12_4_ = 0x219392ef;
      auVar91 = vcmpps_avx(auVar65,auVar227,1);
      auVar248._8_4_ = 0x3f800000;
      auVar248._0_8_ = 0x3f8000003f800000;
      auVar248._12_4_ = 0x3f800000;
      auVar133 = vdivps_avx(auVar248,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar65 = vandps_avx(auVar242,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vcmpps_avx(auVar65,auVar227,1);
      auVar80 = vdivps_avx(auVar248,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar65 = vandps_avx(auVar242,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar65 = vcmpps_avx(auVar65,auVar227,1);
      auVar228._8_4_ = 0x5d5e0b6b;
      auVar228._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar228._12_4_ = 0x5d5e0b6b;
      auVar237 = ZEXT1664(auVar228);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar133,auVar228,auVar91)
      ;
      auVar91 = vdivps_avx(auVar248,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar80,auVar228,auVar53);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar91,auVar228,auVar65);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar90,1);
      auVar133._8_4_ = 0x20;
      auVar133._0_8_ = 0x2000000020;
      auVar133._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar65,auVar133);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar90,5);
      auVar91._8_4_ = 0x40;
      auVar91._0_8_ = 0x4000000040;
      auVar91._12_4_ = 0x40;
      auVar80._8_4_ = 0x60;
      auVar80._0_8_ = 0x6000000060;
      auVar80._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar80,auVar91,auVar65);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar90,5);
      auVar53._8_4_ = 0x80;
      auVar53._0_8_ = 0x8000000080;
      auVar53._12_4_ = 0x80;
      auVar173._8_4_ = 0xa0;
      auVar173._0_8_ = 0xa0000000a0;
      auVar173._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar173,auVar53,auVar65)
      ;
      auVar65 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar90);
      auVar91 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar90);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar262 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar65,auVar8);
      auVar65._8_4_ = 0xff800000;
      auVar65._0_8_ = 0xff800000ff800000;
      auVar65._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar65,auVar91,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar112._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar112._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar112._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar112._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
      }
      else {
        uVar28 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_005b01b4:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005b1a7c;
          pNVar35 = pNVar35 + -1;
          paVar34 = paVar34 + -1;
          aVar2 = *paVar34;
          auVar112 = vcmpps_avx((undefined1  [16])aVar2,(undefined1  [16])tray.tfar.field_0,1);
          uVar21 = vmovmskps_avx(auVar112);
        } while (uVar21 == 0);
        uVar24 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        if (uVar28 < uVar21) {
LAB_005b01f9:
          auVar113 = ZEXT1664((undefined1  [16])aVar2);
          do {
            uVar21 = (uint)root.ptr;
            auVar112 = auVar113._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005b1a7c;
              auVar65 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar112,6);
              if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar65[0xf] < '\0') {
                uVar24 = (ulong)(uVar21 & 0xf);
                if (uVar24 == 8) {
                  auVar112 = vpcmpeqd_avx(auVar112,auVar112);
                  aVar85 = terminated.field_0;
                }
                else {
                  auVar238._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  auVar238._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                  auVar238._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                  uVar26 = 0;
                  do {
                    lVar27 = uVar26 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    uVar22 = vmovmskps_avx(auVar238);
                    uVar11 = 0;
                    uVar25 = CONCAT44((int)(uVar26 >> 0x20),uVar22);
                    for (uVar36 = uVar25; (uVar36 & 1) == 0;
                        uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                      uVar11 = uVar11 + 1;
                    }
                    auVar258 = ZEXT1664(auVar238);
                    uVar36 = 0;
                    while( true ) {
                      auVar112 = auVar258._0_16_;
                      auVar243 = auVar246._0_16_;
                      auVar256 = in_ZMM13._0_16_;
                      if (*(int *)(lVar27 + 0x50 + uVar36 * 4) == -1) break;
                      pGVar3 = (context->scene->geometries).items
                               [*(uint *)(lVar27 + 0x40 + uVar36 * 4)].ptr;
                      fVar38 = (pGVar3->time_range).lower;
                      auVar39._4_4_ = fVar38;
                      auVar39._0_4_ = fVar38;
                      auVar39._8_4_ = fVar38;
                      auVar39._12_4_ = fVar38;
                      fVar67 = pGVar3->fnumTimeSegments;
                      auVar65 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar39);
                      fVar38 = (pGVar3->time_range).upper - fVar38;
                      auVar40._4_4_ = fVar38;
                      auVar40._0_4_ = fVar38;
                      auVar40._8_4_ = fVar38;
                      auVar40._12_4_ = fVar38;
                      auVar65 = vdivps_avx(auVar65,auVar40);
                      auVar41._0_4_ = fVar67 * auVar65._0_4_;
                      auVar41._4_4_ = fVar67 * auVar65._4_4_;
                      auVar41._8_4_ = fVar67 * auVar65._8_4_;
                      auVar41._12_4_ = fVar67 * auVar65._12_4_;
                      auVar65 = vroundps_avx(auVar41,1);
                      fVar67 = fVar67 + -1.0;
                      auVar92._4_4_ = fVar67;
                      auVar92._0_4_ = fVar67;
                      auVar92._8_4_ = fVar67;
                      auVar92._12_4_ = fVar67;
                      auVar65 = vminps_avx(auVar65,auVar92);
                      auVar65 = vmaxps_avx(auVar65,_DAT_01f7aa10);
                      auVar91 = vsubps_avx(auVar41,auVar65);
                      itime.field_0 =
                           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar65);
                      iVar23 = itime.field_0.i[uVar11];
                      auVar93._4_4_ = iVar23;
                      auVar93._0_4_ = iVar23;
                      auVar93._8_4_ = iVar23;
                      auVar93._12_4_ = iVar23;
                      auVar65 = vpcmpeqd_avx(auVar93,(undefined1  [16])itime.field_0);
                      auVar65 = auVar238 & ~auVar65;
                      fVar67 = auVar91._4_4_;
                      fVar68 = auVar91._8_4_;
                      fVar69 = auVar91._12_4_;
                      fVar38 = auVar91._0_4_;
                      if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar65 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar65 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar65[0xf]) {
                        lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives + (long)iVar23 * 0x38);
                        lVar33 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                                          (long)iVar23 * 0x38);
                        uVar30 = (ulong)*(uint *)(lVar27 + uVar36 * 4);
                        uVar32 = (ulong)*(uint *)(lVar27 + 0x10 + uVar36 * 4);
                        uVar22 = *(undefined4 *)(lVar4 + uVar30 * 4);
                        auVar178._4_4_ = uVar22;
                        auVar178._0_4_ = uVar22;
                        auVar178._8_4_ = uVar22;
                        auVar178._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar4 + 4 + uVar30 * 4);
                        auVar191._4_4_ = uVar22;
                        auVar191._0_4_ = uVar22;
                        auVar191._8_4_ = uVar22;
                        auVar191._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar4 + 8 + uVar30 * 4);
                        auVar203._4_4_ = uVar22;
                        auVar203._0_4_ = uVar22;
                        auVar203._8_4_ = uVar22;
                        auVar203._12_4_ = uVar22;
                        fVar70 = *(float *)(lVar33 + uVar30 * 4);
                        fVar87 = *(float *)(lVar33 + 4 + uVar30 * 4);
                        fVar88 = *(float *)(lVar33 + 8 + uVar30 * 4);
                        auVar71._8_4_ = 0x3f800000;
                        auVar71._0_8_ = 0x3f8000003f800000;
                        auVar71._12_4_ = 0x3f800000;
                        auVar65 = vsubps_avx(auVar71,auVar91);
                        auVar259._0_4_ = fVar38 * fVar70;
                        auVar259._4_4_ = fVar67 * fVar70;
                        auVar259._8_4_ = fVar68 * fVar70;
                        auVar259._12_4_ = fVar69 * fVar70;
                        auVar127._0_4_ = fVar38 * fVar87;
                        auVar127._4_4_ = fVar67 * fVar87;
                        auVar127._8_4_ = fVar68 * fVar87;
                        auVar127._12_4_ = fVar69 * fVar87;
                        auVar162._0_4_ = fVar38 * fVar88;
                        auVar162._4_4_ = fVar67 * fVar88;
                        auVar162._8_4_ = fVar68 * fVar88;
                        auVar162._12_4_ = fVar69 * fVar88;
                        auVar261 = vfmadd231ps_fma(auVar259,auVar65,auVar178);
                        auVar140 = vfmadd231ps_fma(auVar127,auVar65,auVar191);
                        auVar168 = vfmadd231ps_fma(auVar162,auVar65,auVar203);
                        uVar22 = *(undefined4 *)(lVar4 + uVar32 * 4);
                        auVar179._4_4_ = uVar22;
                        auVar179._0_4_ = uVar22;
                        auVar179._8_4_ = uVar22;
                        auVar179._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar4 + 4 + uVar32 * 4);
                        auVar192._4_4_ = uVar22;
                        auVar192._0_4_ = uVar22;
                        auVar192._8_4_ = uVar22;
                        auVar192._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar4 + 8 + uVar32 * 4);
                        auVar204._4_4_ = uVar22;
                        auVar204._0_4_ = uVar22;
                        auVar204._8_4_ = uVar22;
                        auVar204._12_4_ = uVar22;
                        fVar70 = *(float *)(lVar33 + uVar32 * 4);
                        fVar87 = *(float *)(lVar33 + 4 + uVar32 * 4);
                        fVar88 = *(float *)(lVar33 + 8 + uVar32 * 4);
                        auVar94._0_4_ = fVar70 * fVar38;
                        auVar94._4_4_ = fVar70 * fVar67;
                        auVar94._8_4_ = fVar70 * fVar68;
                        auVar94._12_4_ = fVar70 * fVar69;
                        auVar217._0_4_ = fVar87 * fVar38;
                        auVar217._4_4_ = fVar87 * fVar67;
                        auVar217._8_4_ = fVar87 * fVar68;
                        auVar217._12_4_ = fVar87 * fVar69;
                        auVar231._0_4_ = fVar88 * fVar38;
                        auVar231._4_4_ = fVar88 * fVar67;
                        auVar231._8_4_ = fVar88 * fVar68;
                        auVar231._12_4_ = fVar88 * fVar69;
                        _local_38a8 = vfmadd231ps_fma(auVar94,auVar65,auVar179);
                        _local_38e8 = vfmadd231ps_fma(auVar217,auVar65,auVar192);
                        _local_38c8 = vfmadd231ps_fma(auVar231,auVar65,auVar204);
                        uVar30 = (ulong)*(uint *)(lVar27 + 0x20 + uVar36 * 4);
                        uVar22 = *(undefined4 *)(lVar4 + uVar30 * 4);
                        auVar180._4_4_ = uVar22;
                        auVar180._0_4_ = uVar22;
                        auVar180._8_4_ = uVar22;
                        auVar180._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar4 + 4 + uVar30 * 4);
                        auVar193._4_4_ = uVar22;
                        auVar193._0_4_ = uVar22;
                        auVar193._8_4_ = uVar22;
                        auVar193._12_4_ = uVar22;
                        uVar22 = *(undefined4 *)(lVar4 + 8 + uVar30 * 4);
                        auVar205._4_4_ = uVar22;
                        auVar205._0_4_ = uVar22;
                        auVar205._8_4_ = uVar22;
                        auVar205._12_4_ = uVar22;
                        fVar70 = *(float *)(lVar33 + uVar30 * 4);
                        fVar87 = *(float *)(lVar33 + 4 + uVar30 * 4);
                        fVar88 = *(float *)(lVar33 + 8 + uVar30 * 4);
                        auVar218._0_4_ = fVar70 * fVar38;
                        auVar218._4_4_ = fVar70 * fVar67;
                        auVar218._8_4_ = fVar70 * fVar68;
                        auVar218._12_4_ = fVar70 * fVar69;
                        auVar232._0_4_ = fVar87 * fVar38;
                        auVar232._4_4_ = fVar87 * fVar67;
                        auVar232._8_4_ = fVar87 * fVar68;
                        auVar232._12_4_ = fVar87 * fVar69;
                        auVar239._0_4_ = fVar88 * fVar38;
                        auVar239._4_4_ = fVar88 * fVar67;
                        auVar239._8_4_ = fVar88 * fVar68;
                        auVar239._12_4_ = fVar88 * fVar69;
                        _local_36e8 = vfmadd231ps_fma(auVar218,auVar65,auVar180);
                        _local_36f8 = vfmadd231ps_fma(auVar232,auVar65,auVar193);
                        _local_3708 = vfmadd231ps_fma(auVar239,auVar65,auVar205);
                        uVar30 = (ulong)*(uint *)(lVar27 + 0x30 + uVar36 * 4);
                        fVar70 = *(float *)(lVar33 + uVar30 * 4);
                        fVar87 = *(float *)(lVar33 + 4 + uVar30 * 4);
                        fVar88 = *(float *)(lVar33 + 8 + uVar30 * 4);
                        auVar219._0_4_ = fVar38 * fVar70;
                        auVar219._4_4_ = fVar67 * fVar70;
                        auVar219._8_4_ = fVar68 * fVar70;
                        auVar219._12_4_ = fVar69 * fVar70;
                        auVar181._0_4_ = fVar38 * fVar87;
                        auVar181._4_4_ = fVar67 * fVar87;
                        auVar181._8_4_ = fVar68 * fVar87;
                        auVar181._12_4_ = fVar69 * fVar87;
                        auVar233._0_4_ = fVar38 * fVar88;
                        auVar233._4_4_ = fVar67 * fVar88;
                        auVar233._8_4_ = fVar68 * fVar88;
                        auVar233._12_4_ = fVar69 * fVar88;
                        uVar22 = *(undefined4 *)(lVar4 + uVar30 * 4);
                        auVar42._4_4_ = uVar22;
                        auVar42._0_4_ = uVar22;
                        auVar42._8_4_ = uVar22;
                        auVar42._12_4_ = uVar22;
                        auVar223 = vfmadd231ps_fma(auVar219,auVar65,auVar42);
                        uVar22 = *(undefined4 *)(lVar4 + 4 + uVar30 * 4);
                        auVar43._4_4_ = uVar22;
                        auVar43._0_4_ = uVar22;
                        auVar43._8_4_ = uVar22;
                        auVar43._12_4_ = uVar22;
                        auVar183 = vfmadd231ps_fma(auVar181,auVar65,auVar43);
                        uVar22 = *(undefined4 *)(lVar4 + 8 + uVar30 * 4);
                        auVar44._4_4_ = uVar22;
                        auVar44._0_4_ = uVar22;
                        auVar44._8_4_ = uVar22;
                        auVar44._12_4_ = uVar22;
                        auVar236 = vfmadd231ps_fma(auVar233,auVar65,auVar44);
                      }
                      else {
                        if (uVar25 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar31 = (ulong)*(uint *)(lVar27 + uVar36 * 4);
                          uVar32 = uVar25;
                          uVar30 = uVar11;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar30] * 0x38;
                            auVar65 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar33) + uVar31 * 4)
                            ;
                            auVar90 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar33) + uVar31 * 4);
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar65._0_4_;
                            uVar22 = vextractps_avx(auVar65,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar65,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar30 * 4) = auVar90._0_4_;
                            uVar22 = vextractps_avx(auVar90,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar90,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            uVar32 = uVar32 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            for (uVar12 = uVar32; (uVar12 & 1) == 0;
                                uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                              uVar30 = uVar30 + 1;
                            }
                          } while (uVar32 != 0);
                          auVar243._8_8_ = p1.field_0._8_8_;
                          auVar243._0_8_ = p1.field_0._0_8_;
                          auVar93 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        auVar83._8_4_ = 0x3f800000;
                        auVar83._0_8_ = 0x3f8000003f800000;
                        auVar83._12_4_ = 0x3f800000;
                        auVar65 = vsubps_avx(auVar83,auVar91);
                        fVar70 = auVar65._0_4_;
                        fVar247 = fVar70 * (float)p0.field_0._16_4_;
                        fVar87 = auVar65._4_4_;
                        fVar253 = fVar87 * (float)p0.field_0._20_4_;
                        fVar88 = auVar65._8_4_;
                        fVar254 = fVar88 * (float)p0.field_0._24_4_;
                        fVar89 = auVar65._12_4_;
                        fVar255 = fVar89 * (float)p0.field_0._28_4_;
                        fVar115 = fVar70 * (float)p0.field_0._32_4_;
                        fVar141 = fVar87 * (float)p0.field_0._36_4_;
                        fVar147 = fVar88 * (float)p0.field_0._40_4_;
                        fVar153 = fVar89 * (float)p0.field_0._44_4_;
                        fVar116 = fVar38 * (float)p1.field_0._16_4_;
                        fVar142 = fVar67 * (float)p1.field_0._20_4_;
                        fVar148 = fVar68 * (float)p1.field_0._24_4_;
                        fVar154 = fVar69 * (float)p1.field_0._28_4_;
                        fVar159 = fVar38 * (float)p1.field_0._32_4_;
                        fVar169 = fVar67 * (float)p1.field_0._36_4_;
                        fVar170 = fVar68 * (float)p1.field_0._40_4_;
                        fVar171 = fVar69 * (float)p1.field_0._44_4_;
                        if (uVar25 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar31 = (ulong)*(uint *)(lVar27 + 0x10 + uVar36 * 4);
                          uVar32 = uVar25;
                          uVar30 = uVar11;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar30] * 0x38;
                            auVar65 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar33) + uVar31 * 4)
                            ;
                            auVar91 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar33) + uVar31 * 4);
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar65._0_4_;
                            uVar22 = vextractps_avx(auVar65,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar65,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar30 * 4) = auVar91._0_4_;
                            uVar22 = vextractps_avx(auVar91,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar91,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            uVar32 = uVar32 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            for (uVar12 = uVar32; (uVar12 & 1) == 0;
                                uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                              uVar30 = uVar30 + 1;
                            }
                          } while (uVar32 != 0);
                          _local_37c8 = p0.field_0._0_16_;
                          _fStack_38a0 = p1.field_0._8_8_;
                          local_38a8 = (undefined1  [8])p1.field_0._0_8_;
                        }
                        fVar117 = fVar70 * (float)p0.field_0._16_4_;
                        fVar143 = fVar87 * (float)p0.field_0._20_4_;
                        fVar149 = fVar88 * (float)p0.field_0._24_4_;
                        fVar155 = fVar89 * (float)p0.field_0._28_4_;
                        fVar118 = fVar70 * (float)p0.field_0._32_4_;
                        fVar144 = fVar87 * (float)p0.field_0._36_4_;
                        fVar150 = fVar88 * (float)p0.field_0._40_4_;
                        fVar156 = fVar89 * (float)p0.field_0._44_4_;
                        fVar119 = fVar38 * (float)p1.field_0._16_4_;
                        fVar145 = fVar67 * (float)p1.field_0._20_4_;
                        fVar151 = fVar68 * (float)p1.field_0._24_4_;
                        fVar157 = fVar69 * (float)p1.field_0._28_4_;
                        fVar120 = fVar38 * (float)p1.field_0._32_4_;
                        fVar146 = fVar67 * (float)p1.field_0._36_4_;
                        fVar152 = fVar68 * (float)p1.field_0._40_4_;
                        fVar158 = fVar69 * (float)p1.field_0._44_4_;
                        auVar65 = auVar237._0_16_;
                        if (uVar25 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar31 = (ulong)*(uint *)(lVar27 + 0x20 + uVar36 * 4);
                          uVar32 = uVar25;
                          uVar30 = uVar11;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar30] * 0x38;
                            auVar65 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar33) + uVar31 * 4)
                            ;
                            auVar91 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar33) + uVar31 * 4);
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar65._0_4_;
                            uVar22 = vextractps_avx(auVar65,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar65,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar30 * 4) = auVar91._0_4_;
                            uVar22 = vextractps_avx(auVar91,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar91,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            uVar32 = uVar32 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            for (uVar12 = uVar32; (uVar12 & 1) == 0;
                                uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                              uVar30 = uVar30 + 1;
                            }
                          } while (uVar32 != 0);
                          _fStack_37d0 = p1.field_0._8_8_;
                          local_37d8 = (undefined1  [8])p1.field_0._0_8_;
                          auVar65 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        fVar172 = fVar70 * (float)p0.field_0._16_4_;
                        fVar184 = fVar87 * (float)p0.field_0._20_4_;
                        fVar185 = fVar88 * (float)p0.field_0._24_4_;
                        fVar186 = fVar89 * (float)p0.field_0._28_4_;
                        fVar187 = fVar70 * (float)p0.field_0._32_4_;
                        fVar197 = fVar87 * (float)p0.field_0._36_4_;
                        fVar198 = fVar88 * (float)p0.field_0._40_4_;
                        fVar199 = fVar89 * (float)p0.field_0._44_4_;
                        fVar200 = fVar38 * (float)p1.field_0._16_4_;
                        fVar211 = fVar67 * (float)p1.field_0._20_4_;
                        fVar212 = fVar68 * (float)p1.field_0._24_4_;
                        fVar213 = fVar69 * (float)p1.field_0._28_4_;
                        fVar214 = fVar38 * (float)p1.field_0._32_4_;
                        fVar224 = fVar67 * (float)p1.field_0._36_4_;
                        fVar225 = fVar68 * (float)p1.field_0._40_4_;
                        fVar226 = fVar69 * (float)p1.field_0._44_4_;
                        auVar91 = auVar238;
                        if (uVar25 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar31 = (ulong)*(uint *)(lVar27 + 0x30 + uVar36 * 4);
                          uVar32 = uVar25;
                          uVar30 = uVar11;
                          do {
                            lVar33 = (long)itime.field_0.i[uVar30] * 0x38;
                            auVar91 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar33) + uVar31 * 4)
                            ;
                            auVar90 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar33) + uVar31 * 4);
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar91._0_4_;
                            uVar22 = vextractps_avx(auVar91,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar91,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            *(int *)((long)&p1.field_0 + uVar30 * 4) = auVar90._0_4_;
                            uVar22 = vextractps_avx(auVar90,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar22;
                            uVar22 = vextractps_avx(auVar90,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar22;
                            uVar32 = uVar32 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            for (uVar12 = uVar32; (uVar12 & 1) == 0;
                                uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                              uVar30 = uVar30 + 1;
                            }
                          } while (uVar32 != 0);
                          auVar256._8_8_ = p1.field_0._8_8_;
                          auVar256._0_8_ = p1.field_0._0_8_;
                          auVar91 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        auVar261._0_4_ = fVar70 * auVar93._0_4_ + auVar243._0_4_ * fVar38;
                        auVar261._4_4_ = fVar87 * auVar93._4_4_ + auVar243._4_4_ * fVar67;
                        auVar261._8_4_ = fVar88 * auVar93._8_4_ + auVar243._8_4_ * fVar68;
                        auVar261._12_4_ = fVar89 * auVar93._12_4_ + auVar243._12_4_ * fVar69;
                        auVar140._0_4_ = fVar247 + fVar116;
                        auVar140._4_4_ = fVar253 + fVar142;
                        auVar140._8_4_ = fVar254 + fVar148;
                        auVar140._12_4_ = fVar255 + fVar154;
                        auVar168._0_4_ = fVar159 + fVar115;
                        auVar168._4_4_ = fVar169 + fVar141;
                        auVar168._8_4_ = fVar170 + fVar147;
                        auVar168._12_4_ = fVar171 + fVar153;
                        local_38a8._4_4_ =
                             fVar87 * (float)local_37c8._4_4_ + fVar67 * (float)local_38a8._4_4_;
                        local_38a8._0_4_ =
                             fVar70 * (float)local_37c8._0_4_ + fVar38 * (float)local_38a8._0_4_;
                        fStack_38a0 = fVar88 * fStack_37c0 + fVar68 * fStack_38a0;
                        fStack_389c = fVar89 * fStack_37bc + fVar69 * fStack_389c;
                        local_38e8._4_4_ = fVar145 + fVar143;
                        local_38e8._0_4_ = fVar119 + fVar117;
                        fStack_38e0 = fVar151 + fVar149;
                        fStack_38dc = fVar157 + fVar155;
                        local_38c8._4_4_ = fVar146 + fVar144;
                        local_38c8._0_4_ = fVar120 + fVar118;
                        fStack_38c0 = fVar152 + fVar150;
                        fStack_38bc = fVar158 + fVar156;
                        local_36e8._4_4_ = auVar65._4_4_ * fVar87 + fVar67 * (float)local_37d8._4_4_
                        ;
                        local_36e8._0_4_ = auVar65._0_4_ * fVar70 + fVar38 * (float)local_37d8._0_4_
                        ;
                        fStack_36e0 = auVar65._8_4_ * fVar88 + fVar68 * fStack_37d0;
                        fStack_36dc = auVar65._12_4_ * fVar89 + fVar69 * fStack_37cc;
                        local_36f8._4_4_ = fVar184 + fVar211;
                        local_36f8._0_4_ = fVar172 + fVar200;
                        fStack_36f0 = fVar185 + fVar212;
                        fStack_36ec = fVar186 + fVar213;
                        local_3708._4_4_ = fVar224 + fVar197;
                        local_3708._0_4_ = fVar214 + fVar187;
                        fStack_3700 = fVar225 + fVar198;
                        fStack_36fc = fVar226 + fVar199;
                        auVar223._0_4_ = auVar91._0_4_ * fVar70 + auVar256._0_4_ * fVar38;
                        auVar223._4_4_ = auVar91._4_4_ * fVar87 + auVar256._4_4_ * fVar67;
                        auVar223._8_4_ = auVar91._8_4_ * fVar88 + auVar256._8_4_ * fVar68;
                        auVar223._12_4_ = auVar91._12_4_ * fVar89 + auVar256._12_4_ * fVar69;
                        auVar183._0_4_ =
                             fVar70 * (float)p0.field_0._16_4_ + fVar38 * (float)p1.field_0._16_4_;
                        auVar183._4_4_ =
                             fVar87 * (float)p0.field_0._20_4_ + fVar67 * (float)p1.field_0._20_4_;
                        auVar183._8_4_ =
                             fVar88 * (float)p0.field_0._24_4_ + fVar68 * (float)p1.field_0._24_4_;
                        auVar183._12_4_ =
                             fVar89 * (float)p0.field_0._28_4_ + fVar69 * (float)p1.field_0._28_4_;
                        auVar236._0_4_ =
                             fVar70 * (float)p0.field_0._32_4_ + fVar38 * (float)p1.field_0._32_4_;
                        auVar236._4_4_ =
                             fVar87 * (float)p0.field_0._36_4_ + fVar67 * (float)p1.field_0._36_4_;
                        auVar236._8_4_ =
                             fVar88 * (float)p0.field_0._40_4_ + fVar68 * (float)p1.field_0._40_4_;
                        auVar236._12_4_ =
                             fVar89 * (float)p0.field_0._44_4_ + fVar69 * (float)p1.field_0._44_4_;
                      }
                      auVar65 = *(undefined1 (*) [16])ray;
                      auVar91 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar90 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar80 = vsubps_avx(auVar261,auVar65);
                      auVar173 = vsubps_avx(auVar140,auVar91);
                      auVar227 = vsubps_avx(auVar168,auVar90);
                      auVar228 = vsubps_avx(auVar223,auVar65);
                      auVar248 = vsubps_avx(auVar183,auVar91);
                      auVar9 = vsubps_avx(auVar236,auVar90);
                      _local_37c8 = vsubps_avx(auVar228,auVar80);
                      auVar10 = vsubps_avx(auVar248,auVar173);
                      _local_37d8 = vsubps_avx(auVar9,auVar227);
                      auVar128._0_4_ = auVar228._0_4_ + auVar80._0_4_;
                      auVar128._4_4_ = auVar228._4_4_ + auVar80._4_4_;
                      auVar128._8_4_ = auVar228._8_4_ + auVar80._8_4_;
                      auVar128._12_4_ = auVar228._12_4_ + auVar80._12_4_;
                      auVar163._0_4_ = auVar248._0_4_ + auVar173._0_4_;
                      auVar163._4_4_ = auVar248._4_4_ + auVar173._4_4_;
                      auVar163._8_4_ = auVar248._8_4_ + auVar173._8_4_;
                      auVar163._12_4_ = auVar248._12_4_ + auVar173._12_4_;
                      fVar38 = auVar227._0_4_;
                      auVar234._0_4_ = auVar9._0_4_ + fVar38;
                      fVar67 = auVar227._4_4_;
                      auVar234._4_4_ = auVar9._4_4_ + fVar67;
                      fVar68 = auVar227._8_4_;
                      auVar234._8_4_ = auVar9._8_4_ + fVar68;
                      fVar69 = auVar227._12_4_;
                      auVar234._12_4_ = auVar9._12_4_ + fVar69;
                      auVar260._0_4_ = auVar163._0_4_ * local_37d8._0_4_;
                      auVar260._4_4_ = auVar163._4_4_ * local_37d8._4_4_;
                      auVar260._8_4_ = auVar163._8_4_ * local_37d8._8_4_;
                      auVar260._12_4_ = auVar163._12_4_ * local_37d8._12_4_;
                      auVar121 = vfmsub231ps_fma(auVar260,auVar10,auVar234);
                      auVar244._0_4_ = auVar234._0_4_ * local_37c8._0_4_;
                      auVar244._4_4_ = auVar234._4_4_ * local_37c8._4_4_;
                      auVar244._8_4_ = auVar234._8_4_ * local_37c8._8_4_;
                      auVar244._12_4_ = auVar234._12_4_ * local_37c8._12_4_;
                      auVar133 = vfmsub231ps_fma(auVar244,_local_37d8,auVar128);
                      auVar45._0_4_ = auVar128._0_4_ * auVar10._0_4_;
                      auVar45._4_4_ = auVar128._4_4_ * auVar10._4_4_;
                      auVar45._8_4_ = auVar128._8_4_ * auVar10._8_4_;
                      auVar45._12_4_ = auVar128._12_4_ * auVar10._12_4_;
                      auVar53 = vfmsub231ps_fma(auVar45,_local_37c8,auVar163);
                      fVar147 = *(float *)(ray + 0x60);
                      fVar148 = *(float *)(ray + 100);
                      fVar153 = *(float *)(ray + 0x68);
                      auVar16 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar154 = *(float *)(ray + 0x6c);
                      auVar235._0_4_ = fVar147 * auVar53._0_4_;
                      auVar235._4_4_ = fVar148 * auVar53._4_4_;
                      auVar235._8_4_ = fVar153 * auVar53._8_4_;
                      auVar235._12_4_ = fVar154 * auVar53._12_4_;
                      auVar53 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar13 = vfmadd231ps_fma(auVar235,auVar53,auVar133);
                      auVar133 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar123 = vfmadd231ps_fma(auVar13,auVar133,auVar121);
                      auVar237 = ZEXT1664(auVar123);
                      auVar65 = vsubps_avx(_local_38a8,auVar65);
                      auVar91 = vsubps_avx(_local_38e8,auVar91);
                      auVar90 = vsubps_avx(_local_38c8,auVar90);
                      auVar13 = vsubps_avx(auVar173,auVar91);
                      auVar227 = vsubps_avx(auVar227,auVar90);
                      auVar164._0_4_ = auVar173._0_4_ + auVar91._0_4_;
                      auVar164._4_4_ = auVar173._4_4_ + auVar91._4_4_;
                      auVar164._8_4_ = auVar173._8_4_ + auVar91._8_4_;
                      auVar164._12_4_ = auVar173._12_4_ + auVar91._12_4_;
                      auVar249._0_4_ = fVar38 + auVar90._0_4_;
                      auVar249._4_4_ = fVar67 + auVar90._4_4_;
                      auVar249._8_4_ = fVar68 + auVar90._8_4_;
                      auVar249._12_4_ = fVar69 + auVar90._12_4_;
                      fVar159 = auVar227._0_4_;
                      auVar95._0_4_ = fVar159 * auVar164._0_4_;
                      fVar169 = auVar227._4_4_;
                      auVar95._4_4_ = fVar169 * auVar164._4_4_;
                      fVar170 = auVar227._8_4_;
                      auVar95._8_4_ = fVar170 * auVar164._8_4_;
                      fVar171 = auVar227._12_4_;
                      auVar95._12_4_ = fVar171 * auVar164._12_4_;
                      auVar124 = vfmsub231ps_fma(auVar95,auVar13,auVar249);
                      auVar121 = vsubps_avx(auVar80,auVar65);
                      fVar70 = auVar121._0_4_;
                      auVar250._0_4_ = auVar249._0_4_ * fVar70;
                      fVar88 = auVar121._4_4_;
                      auVar250._4_4_ = auVar249._4_4_ * fVar88;
                      fVar115 = auVar121._8_4_;
                      auVar250._8_4_ = auVar249._8_4_ * fVar115;
                      fVar141 = auVar121._12_4_;
                      auVar250._12_4_ = auVar249._12_4_ * fVar141;
                      auVar194._0_4_ = auVar80._0_4_ + auVar65._0_4_;
                      auVar194._4_4_ = auVar80._4_4_ + auVar65._4_4_;
                      auVar194._8_4_ = auVar80._8_4_ + auVar65._8_4_;
                      auVar194._12_4_ = auVar80._12_4_ + auVar65._12_4_;
                      auVar122 = vfmsub231ps_fma(auVar250,auVar227,auVar194);
                      fVar87 = auVar13._0_4_;
                      auVar195._0_4_ = auVar194._0_4_ * fVar87;
                      fVar89 = auVar13._4_4_;
                      auVar195._4_4_ = auVar194._4_4_ * fVar89;
                      fVar116 = auVar13._8_4_;
                      auVar195._8_4_ = auVar194._8_4_ * fVar116;
                      fVar142 = auVar13._12_4_;
                      auVar195._12_4_ = auVar194._12_4_ * fVar142;
                      auVar125 = vfmsub231ps_fma(auVar195,auVar121,auVar164);
                      auVar165._0_4_ = fVar147 * auVar125._0_4_;
                      auVar165._4_4_ = fVar148 * auVar125._4_4_;
                      auVar165._8_4_ = fVar153 * auVar125._8_4_;
                      auVar165._12_4_ = fVar154 * auVar125._12_4_;
                      auVar122 = vfmadd231ps_fma(auVar165,auVar53,auVar122);
                      auVar124 = vfmadd231ps_fma(auVar122,auVar133,auVar124);
                      auVar122 = vsubps_avx(auVar65,auVar228);
                      auVar46._0_4_ = auVar228._0_4_ + auVar65._0_4_;
                      auVar46._4_4_ = auVar228._4_4_ + auVar65._4_4_;
                      auVar46._8_4_ = auVar228._8_4_ + auVar65._8_4_;
                      auVar46._12_4_ = auVar228._12_4_ + auVar65._12_4_;
                      auVar228 = vsubps_avx(auVar91,auVar248);
                      auVar96._0_4_ = auVar248._0_4_ + auVar91._0_4_;
                      auVar96._4_4_ = auVar248._4_4_ + auVar91._4_4_;
                      auVar96._8_4_ = auVar248._8_4_ + auVar91._8_4_;
                      auVar96._12_4_ = auVar248._12_4_ + auVar91._12_4_;
                      auVar248 = vsubps_avx(auVar90,auVar9);
                      auVar72._0_4_ = auVar90._0_4_ + auVar9._0_4_;
                      auVar72._4_4_ = auVar90._4_4_ + auVar9._4_4_;
                      auVar72._8_4_ = auVar90._8_4_ + auVar9._8_4_;
                      auVar72._12_4_ = auVar90._12_4_ + auVar9._12_4_;
                      auVar129._0_4_ = auVar248._0_4_ * auVar96._0_4_;
                      auVar129._4_4_ = auVar248._4_4_ * auVar96._4_4_;
                      auVar129._8_4_ = auVar248._8_4_ * auVar96._8_4_;
                      auVar129._12_4_ = auVar248._12_4_ * auVar96._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar129,auVar228,auVar72);
                      auVar73._0_4_ = auVar122._0_4_ * auVar72._0_4_;
                      auVar73._4_4_ = auVar122._4_4_ * auVar72._4_4_;
                      auVar73._8_4_ = auVar122._8_4_ * auVar72._8_4_;
                      auVar73._12_4_ = auVar122._12_4_ * auVar72._12_4_;
                      auVar65 = vfmsub231ps_fma(auVar73,auVar248,auVar46);
                      auVar47._0_4_ = auVar228._0_4_ * auVar46._0_4_;
                      auVar47._4_4_ = auVar228._4_4_ * auVar46._4_4_;
                      auVar47._8_4_ = auVar228._8_4_ * auVar46._8_4_;
                      auVar47._12_4_ = auVar228._12_4_ * auVar46._12_4_;
                      auVar90 = vfmsub231ps_fma(auVar47,auVar122,auVar96);
                      auVar48._0_4_ = fVar147 * auVar90._0_4_;
                      auVar48._4_4_ = fVar148 * auVar90._4_4_;
                      auVar48._8_4_ = fVar153 * auVar90._8_4_;
                      auVar48._12_4_ = fVar154 * auVar90._12_4_;
                      auVar65 = vfmadd231ps_fma(auVar48,auVar53,auVar65);
                      auVar9 = vfmadd231ps_fma(auVar65,auVar133,auVar91);
                      auVar182._0_4_ = auVar9._0_4_ + auVar123._0_4_ + auVar124._0_4_;
                      auVar182._4_4_ = auVar9._4_4_ + auVar123._4_4_ + auVar124._4_4_;
                      auVar182._8_4_ = auVar9._8_4_ + auVar123._8_4_ + auVar124._8_4_;
                      auVar182._12_4_ = auVar9._12_4_ + auVar123._12_4_ + auVar124._12_4_;
                      auVar65 = vminps_avx(auVar123,auVar124);
                      auVar91 = vminps_avx(auVar65,auVar9);
                      auVar65 = vandps_avx(auVar242,auVar182);
                      in_ZMM13 = ZEXT1664(auVar65);
                      auVar245._8_4_ = 0x80000000;
                      auVar245._0_8_ = 0x8000000080000000;
                      auVar245._12_4_ = 0x80000000;
                      auVar246 = ZEXT1664(auVar245);
                      auVar97._0_4_ = auVar65._0_4_ * 1.1920929e-07;
                      auVar97._4_4_ = auVar65._4_4_ * 1.1920929e-07;
                      auVar97._8_4_ = auVar65._8_4_ * 1.1920929e-07;
                      auVar97._12_4_ = auVar65._12_4_ * 1.1920929e-07;
                      uVar30 = CONCAT44(auVar97._4_4_,auVar97._0_4_);
                      auVar130._0_8_ = uVar30 ^ 0x8000000080000000;
                      auVar130._8_4_ = -auVar97._8_4_;
                      auVar130._12_4_ = -auVar97._12_4_;
                      auVar91 = vcmpps_avx(auVar91,auVar130,5);
                      auVar90 = vmaxps_avx(auVar123,auVar124);
                      auVar90 = vmaxps_avx(auVar90,auVar9);
                      auVar90 = vcmpps_avx(auVar90,auVar97,2);
                      auVar91 = vorps_avx(auVar91,auVar90);
                      auVar90 = auVar112 & auVar91;
                      if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar90[0xf]) {
                        auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                      }
                      else {
                        in_ZMM13 = ZEXT1664(auVar245);
                        auVar49._0_4_ = fVar87 * local_37d8._0_4_;
                        auVar49._4_4_ = fVar89 * local_37d8._4_4_;
                        auVar49._8_4_ = fVar116 * local_37d8._8_4_;
                        auVar49._12_4_ = fVar142 * local_37d8._12_4_;
                        auVar74._0_4_ = auVar10._0_4_ * fVar70;
                        auVar74._4_4_ = auVar10._4_4_ * fVar88;
                        auVar74._8_4_ = auVar10._8_4_ * fVar115;
                        auVar74._12_4_ = auVar10._12_4_ * fVar141;
                        auVar9 = vfmsub213ps_fma(auVar10,auVar227,auVar49);
                        auVar98._0_4_ = auVar228._0_4_ * fVar159;
                        auVar98._4_4_ = auVar228._4_4_ * fVar169;
                        auVar98._8_4_ = auVar228._8_4_ * fVar170;
                        auVar98._12_4_ = auVar228._12_4_ * fVar171;
                        auVar131._0_4_ = auVar248._0_4_ * fVar70;
                        auVar131._4_4_ = auVar248._4_4_ * fVar88;
                        auVar131._8_4_ = auVar248._8_4_ * fVar115;
                        auVar131._12_4_ = auVar248._12_4_ * fVar141;
                        auVar10 = vfmsub213ps_fma(auVar248,auVar13,auVar98);
                        auVar90 = vandps_avx(auVar242,auVar49);
                        auVar248 = vandps_avx(auVar242,auVar98);
                        auVar90 = vcmpps_avx(auVar90,auVar248,1);
                        vVar6.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx(auVar10,auVar9,auVar90);
                        auVar50._0_4_ = auVar122._0_4_ * fVar87;
                        auVar50._4_4_ = auVar122._4_4_ * fVar89;
                        auVar50._8_4_ = auVar122._8_4_ * fVar116;
                        auVar50._12_4_ = auVar122._12_4_ * fVar142;
                        auVar248 = vfmsub213ps_fma(auVar122,auVar227,auVar131);
                        auVar99._0_4_ = local_37c8._0_4_ * fVar159;
                        auVar99._4_4_ = local_37c8._4_4_ * fVar169;
                        auVar99._8_4_ = local_37c8._8_4_ * fVar170;
                        auVar99._12_4_ = local_37c8._12_4_ * fVar171;
                        auVar9 = vfmsub213ps_fma(_local_37d8,auVar121,auVar99);
                        auVar90 = vandps_avx(auVar242,auVar99);
                        auVar227 = vandps_avx(auVar242,auVar131);
                        auVar90 = vcmpps_avx(auVar90,auVar227,1);
                        vVar7.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx(auVar248,auVar9,auVar90);
                        auVar248 = vfmsub213ps_fma(_local_37c8,auVar13,auVar74);
                        auVar228 = vfmsub213ps_fma(auVar228,auVar121,auVar50);
                        auVar90 = vandps_avx(auVar242,auVar74);
                        auVar227 = vandps_avx(auVar242,auVar50);
                        auVar90 = vcmpps_avx(auVar90,auVar227,1);
                        auVar227 = vblendvps_avx(auVar228,auVar248,auVar90);
                        auVar246 = ZEXT1664(auVar227);
                        local_3698 = auVar16._0_4_;
                        fStack_3694 = auVar16._4_4_;
                        fStack_3690 = auVar16._8_4_;
                        auVar51._0_4_ = auVar227._0_4_ * local_3698;
                        auVar51._4_4_ = auVar227._4_4_ * fStack_3694;
                        auVar51._8_4_ = auVar227._8_4_ * fStack_3690;
                        auVar51._12_4_ = auVar227._12_4_ * fVar154;
                        auVar90 = vfmadd213ps_fma(auVar53,(undefined1  [16])vVar7.field_0,auVar51);
                        auVar90 = vfmadd213ps_fma(auVar133,(undefined1  [16])vVar6.field_0,auVar90);
                        auVar52._0_4_ = auVar90._0_4_ + auVar90._0_4_;
                        auVar52._4_4_ = auVar90._4_4_ + auVar90._4_4_;
                        auVar52._8_4_ = auVar90._8_4_ + auVar90._8_4_;
                        auVar52._12_4_ = auVar90._12_4_ + auVar90._12_4_;
                        auVar75._0_4_ = auVar227._0_4_ * fVar38;
                        auVar75._4_4_ = auVar227._4_4_ * fVar67;
                        auVar75._8_4_ = auVar227._8_4_ * fVar68;
                        auVar75._12_4_ = auVar227._12_4_ * fVar69;
                        auVar90 = vfmadd213ps_fma(auVar173,(undefined1  [16])vVar7.field_0,auVar75);
                        auVar53 = vfmadd213ps_fma(auVar80,(undefined1  [16])vVar6.field_0,auVar90);
                        auVar90 = vrcpps_avx(auVar52);
                        auVar206._8_4_ = 0x3f800000;
                        auVar206._0_8_ = 0x3f8000003f800000;
                        auVar206._12_4_ = 0x3f800000;
                        auVar133 = vfnmadd213ps_fma(auVar90,auVar52,auVar206);
                        auVar90 = vfmadd132ps_fma(auVar133,auVar90,auVar90);
                        auVar100._0_4_ = (auVar53._0_4_ + auVar53._0_4_) * auVar90._0_4_;
                        auVar100._4_4_ = (auVar53._4_4_ + auVar53._4_4_) * auVar90._4_4_;
                        auVar100._8_4_ = (auVar53._8_4_ + auVar53._8_4_) * auVar90._8_4_;
                        auVar100._12_4_ = (auVar53._12_4_ + auVar53._12_4_) * auVar90._12_4_;
                        auVar90 = *(undefined1 (*) [16])(ray + 0x80);
                        auVar237 = ZEXT1664(auVar90);
                        auVar53 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar100,2);
                        auVar133 = vcmpps_avx(auVar100,auVar90,2);
                        auVar53 = vandps_avx(auVar53,auVar133);
                        uVar30 = CONCAT44(auVar52._4_4_,auVar52._0_4_);
                        auVar132._0_8_ = uVar30 ^ 0x8000000080000000;
                        auVar132._8_4_ = -auVar52._8_4_;
                        auVar132._12_4_ = -auVar52._12_4_;
                        auVar133 = vcmpps_avx(auVar52,auVar132,4);
                        auVar53 = vandps_avx(auVar133,auVar53);
                        auVar91 = vandps_avx(auVar112,auVar91);
                        auVar53 = vpslld_avx(auVar53,0x1f);
                        auVar133 = vpsrad_avx(auVar53,0x1f);
                        auVar53 = auVar91 & auVar133;
                        if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar53[0xf]) {
                          auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                        CONCAT48(0x7f800000,0x7f8000007f800000)));
                        }
                        else {
                          auVar91 = vandps_avx(auVar133,auVar91);
                          uVar21 = pGVar3->mask;
                          auVar54._4_4_ = uVar21;
                          auVar54._0_4_ = uVar21;
                          auVar54._8_4_ = uVar21;
                          auVar54._12_4_ = uVar21;
                          auVar53 = vpand_avx(auVar54,*(undefined1 (*) [16])(ray + 0x90));
                          auVar53 = vpcmpeqd_avx(auVar53,_DAT_01f7aa10);
                          auVar133 = auVar91 & ~auVar53;
                          auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                        CONCAT48(0x7f800000,0x7f8000007f800000)));
                          if ((((auVar133 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar133 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar133 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar133[0xf] < '\0') {
                            aVar84 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     vandnps_avx(auVar53,auVar91);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar91 = vrcpps_avx(auVar182);
                              auVar210._8_4_ = 0x3f800000;
                              auVar210._0_8_ = 0x3f8000003f800000;
                              auVar210._12_4_ = 0x3f800000;
                              auVar53 = vfnmadd213ps_fma(auVar182,auVar91,auVar210);
                              auVar91 = vfmadd132ps_fma(auVar53,auVar91,auVar91);
                              auVar61._8_4_ = 0x219392ef;
                              auVar61._0_8_ = 0x219392ef219392ef;
                              auVar61._12_4_ = 0x219392ef;
                              auVar65 = vcmpps_avx(auVar65,auVar61,5);
                              auVar65 = vandps_avx(auVar65,auVar91);
                              auVar139._0_4_ = auVar65._0_4_ * auVar123._0_4_;
                              auVar139._4_4_ = auVar65._4_4_ * auVar123._4_4_;
                              auVar139._8_4_ = auVar65._8_4_ * auVar123._8_4_;
                              auVar139._12_4_ = auVar65._12_4_ * auVar123._12_4_;
                              auVar91 = vminps_avx(auVar139,auVar210);
                              auVar62._0_4_ = auVar124._0_4_ * auVar65._0_4_;
                              auVar62._4_4_ = auVar124._4_4_ * auVar65._4_4_;
                              auVar62._8_4_ = auVar124._8_4_ * auVar65._8_4_;
                              auVar62._12_4_ = auVar124._12_4_ * auVar65._12_4_;
                              auVar65 = vminps_avx(auVar62,auVar210);
                              auVar53 = vsubps_avx(auVar210,auVar91);
                              auVar133 = vsubps_avx(auVar210,auVar65);
                              auVar15._8_8_ = uVar18;
                              auVar15._0_8_ = uVar17;
                              vblendvps_avx(auVar91,auVar53,auVar15);
                              auVar65 = vblendvps_avx(auVar65,auVar133,auVar15);
                              p0.field_0.field_0.x.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar6.field_0;
                              p0.field_0.field_0.y.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar7.field_0;
                              p0.field_0._32_16_ = auVar227;
                              vpcmpeqd_avx2(ZEXT1632(auVar65),ZEXT1632(auVar65));
                              auVar65 = vblendvps_avx(auVar90,auVar100,(undefined1  [16])aVar84);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar65;
                              itime.field_0 = aVar84;
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar3->userPtr;
                              p1.field_0._16_8_ = context->user;
                              p1.field_0._24_8_ = ray;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._40_4_ = 4;
                              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar246 = ZEXT1664(auVar227);
                                in_ZMM13 = ZEXT1664(auVar245);
                                auVar237._0_8_ =
                                     (*pGVar3->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1)
                                ;
                                auVar237._8_56_ = extraout_var;
                                auVar65 = auVar237._0_16_;
                                auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                              if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0)
                              {
                                auVar65 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar65 = auVar65 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var5 = context->args->filter;
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar246 = ZEXT1664(auVar246._0_16_);
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  auVar262._0_8_ = (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                                  auVar262._8_56_ = extraout_var_00;
                                  auVar65 = auVar262._0_16_;
                                  auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                                CONCAT48(0x7f800000,
                                                                         0x7f8000007f800000)));
                                }
                                auVar91 = vpcmpeqd_avx((undefined1  [16])itime.field_0,_DAT_01f7aa10
                                                      );
                                auVar65 = vpcmpeqd_avx(auVar65,auVar65);
                                auVar65 = auVar91 ^ auVar65;
                                auVar109._8_4_ = 0xff800000;
                                auVar109._0_8_ = 0xff800000ff800000;
                                auVar109._12_4_ = 0xff800000;
                                auVar91 = vblendvps_avx(auVar109,*(undefined1 (*) [16])
                                                                  (p1.field_0._24_8_ + 0x80),auVar91
                                                       );
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar91;
                              }
                              auVar65 = vpslld_avx(auVar65,0x1f);
                              aVar84 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vpsrad_avx(auVar65,0x1f);
                              auVar65 = vblendvps_avx(auVar90,*(undefined1 (*) [16])pRVar1,auVar65);
                              *(undefined1 (*) [16])pRVar1 = auVar65;
                            }
                            auVar237 = ZEXT1664(auVar90);
                            auVar112 = vpandn_avx((undefined1  [16])aVar84,auVar112);
                          }
                        }
                      }
                      auVar113 = ZEXT1664(_local_38a8);
                      if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar112 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar112 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar112[0xf]) break;
                      auVar65 = *(undefined1 (*) [16])ray;
                      auVar91 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar90 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar80 = vsubps_avx(_local_36e8,auVar65);
                      auVar173 = vsubps_avx(_local_36f8,auVar91);
                      _local_37c8 = vsubps_avx(_local_3708,auVar90);
                      auVar53 = vsubps_avx(auVar223,auVar65);
                      auVar133 = vsubps_avx(auVar183,auVar91);
                      auVar227 = vsubps_avx(auVar236,auVar90);
                      auVar228 = vsubps_avx(_local_38a8,auVar65);
                      auVar248 = vsubps_avx(_local_38e8,auVar91);
                      auVar90 = vsubps_avx(_local_38c8,auVar90);
                      _local_37d8 = vsubps_avx(auVar228,auVar80);
                      auVar9 = vsubps_avx(auVar248,auVar173);
                      auVar10 = vsubps_avx(auVar90,_local_37c8);
                      auVar220._0_4_ = auVar228._0_4_ + auVar80._0_4_;
                      auVar220._4_4_ = auVar228._4_4_ + auVar80._4_4_;
                      auVar220._8_4_ = auVar228._8_4_ + auVar80._8_4_;
                      auVar220._12_4_ = auVar228._12_4_ + auVar80._12_4_;
                      auVar240._0_4_ = auVar248._0_4_ + auVar173._0_4_;
                      auVar240._4_4_ = auVar248._4_4_ + auVar173._4_4_;
                      auVar240._8_4_ = auVar248._8_4_ + auVar173._8_4_;
                      auVar240._12_4_ = auVar248._12_4_ + auVar173._12_4_;
                      fVar38 = local_37c8._0_4_;
                      auVar251._0_4_ = auVar90._0_4_ + fVar38;
                      fVar67 = local_37c8._4_4_;
                      auVar251._4_4_ = auVar90._4_4_ + fVar67;
                      fVar68 = local_37c8._8_4_;
                      auVar251._8_4_ = auVar90._8_4_ + fVar68;
                      fVar69 = local_37c8._12_4_;
                      auVar251._12_4_ = auVar90._12_4_ + fVar69;
                      auVar257._0_4_ = auVar240._0_4_ * auVar10._0_4_;
                      auVar257._4_4_ = auVar240._4_4_ * auVar10._4_4_;
                      auVar257._8_4_ = auVar240._8_4_ * auVar10._8_4_;
                      auVar257._12_4_ = auVar240._12_4_ * auVar10._12_4_;
                      auVar121 = vfmsub231ps_fma(auVar257,auVar9,auVar251);
                      auVar252._0_4_ = auVar251._0_4_ * local_37d8._0_4_;
                      auVar252._4_4_ = auVar251._4_4_ * local_37d8._4_4_;
                      auVar252._8_4_ = auVar251._8_4_ * local_37d8._8_4_;
                      auVar252._12_4_ = auVar251._12_4_ * local_37d8._12_4_;
                      auVar91 = vfmsub231ps_fma(auVar252,auVar10,auVar220);
                      auVar221._0_4_ = auVar220._0_4_ * auVar9._0_4_;
                      auVar221._4_4_ = auVar220._4_4_ * auVar9._4_4_;
                      auVar221._8_4_ = auVar220._8_4_ * auVar9._8_4_;
                      auVar221._12_4_ = auVar220._12_4_ * auVar9._12_4_;
                      auVar65 = vfmsub231ps_fma(auVar221,_local_37d8,auVar240);
                      fVar147 = *(float *)(ray + 0x60);
                      fVar148 = *(float *)(ray + 100);
                      fVar153 = *(float *)(ray + 0x68);
                      auVar16 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar154 = *(float *)(ray + 0x6c);
                      auVar241._0_4_ = auVar65._0_4_ * fVar147;
                      auVar241._4_4_ = auVar65._4_4_ * fVar148;
                      auVar241._8_4_ = auVar65._8_4_ * fVar153;
                      auVar241._12_4_ = auVar65._12_4_ * fVar154;
                      auVar65 = *(undefined1 (*) [16])(ray + 0x50);
                      auVar13 = vfmadd231ps_fma(auVar241,auVar65,auVar91);
                      auVar91 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar124 = vfmadd231ps_fma(auVar13,auVar91,auVar121);
                      auVar13 = vsubps_avx(auVar173,auVar133);
                      in_ZMM13 = ZEXT1664(auVar227);
                      auVar121 = vsubps_avx(_local_37c8,auVar227);
                      auVar222._0_4_ = auVar173._0_4_ + auVar133._0_4_;
                      auVar222._4_4_ = auVar173._4_4_ + auVar133._4_4_;
                      auVar222._8_4_ = auVar173._8_4_ + auVar133._8_4_;
                      auVar222._12_4_ = auVar173._12_4_ + auVar133._12_4_;
                      auVar101._0_4_ = auVar227._0_4_ + fVar38;
                      auVar101._4_4_ = auVar227._4_4_ + fVar67;
                      auVar101._8_4_ = auVar227._8_4_ + fVar68;
                      auVar101._12_4_ = auVar227._12_4_ + fVar69;
                      fVar70 = auVar121._0_4_;
                      auVar134._0_4_ = auVar222._0_4_ * fVar70;
                      fVar88 = auVar121._4_4_;
                      auVar134._4_4_ = auVar222._4_4_ * fVar88;
                      fVar115 = auVar121._8_4_;
                      auVar134._8_4_ = auVar222._8_4_ * fVar115;
                      fVar141 = auVar121._12_4_;
                      auVar134._12_4_ = auVar222._12_4_ * fVar141;
                      auVar125 = vfmsub231ps_fma(auVar134,auVar13,auVar101);
                      auVar122 = vsubps_avx(auVar80,auVar53);
                      fVar159 = auVar122._0_4_;
                      auVar102._0_4_ = fVar159 * auVar101._0_4_;
                      fVar169 = auVar122._4_4_;
                      auVar102._4_4_ = fVar169 * auVar101._4_4_;
                      fVar170 = auVar122._8_4_;
                      auVar102._8_4_ = fVar170 * auVar101._8_4_;
                      fVar171 = auVar122._12_4_;
                      auVar102._12_4_ = fVar171 * auVar101._12_4_;
                      auVar207._0_4_ = auVar53._0_4_ + auVar80._0_4_;
                      auVar207._4_4_ = auVar53._4_4_ + auVar80._4_4_;
                      auVar207._8_4_ = auVar53._8_4_ + auVar80._8_4_;
                      auVar207._12_4_ = auVar53._12_4_ + auVar80._12_4_;
                      auVar123 = vfmsub231ps_fma(auVar102,auVar121,auVar207);
                      fVar87 = auVar13._0_4_;
                      auVar208._0_4_ = auVar207._0_4_ * fVar87;
                      fVar89 = auVar13._4_4_;
                      auVar208._4_4_ = auVar207._4_4_ * fVar89;
                      fVar116 = auVar13._8_4_;
                      auVar208._8_4_ = auVar207._8_4_ * fVar116;
                      fVar142 = auVar13._12_4_;
                      auVar208._12_4_ = auVar207._12_4_ * fVar142;
                      auVar126 = vfmsub231ps_fma(auVar208,auVar122,auVar222);
                      auVar209._0_4_ = fVar147 * auVar126._0_4_;
                      auVar209._4_4_ = fVar148 * auVar126._4_4_;
                      auVar209._8_4_ = fVar153 * auVar126._8_4_;
                      auVar209._12_4_ = fVar154 * auVar126._12_4_;
                      auVar123 = vfmadd231ps_fma(auVar209,auVar65,auVar123);
                      auVar125 = vfmadd231ps_fma(auVar123,auVar91,auVar125);
                      auVar123 = vsubps_avx(auVar53,auVar228);
                      auVar103._0_4_ = auVar53._0_4_ + auVar228._0_4_;
                      auVar103._4_4_ = auVar53._4_4_ + auVar228._4_4_;
                      auVar103._8_4_ = auVar53._8_4_ + auVar228._8_4_;
                      auVar103._12_4_ = auVar53._12_4_ + auVar228._12_4_;
                      auVar228 = vsubps_avx(auVar133,auVar248);
                      auVar76._0_4_ = auVar248._0_4_ + auVar133._0_4_;
                      auVar76._4_4_ = auVar248._4_4_ + auVar133._4_4_;
                      auVar76._8_4_ = auVar248._8_4_ + auVar133._8_4_;
                      auVar76._12_4_ = auVar248._12_4_ + auVar133._12_4_;
                      auVar248 = vsubps_avx(auVar227,auVar90);
                      auVar246 = ZEXT1664(auVar248);
                      auVar55._0_4_ = auVar227._0_4_ + auVar90._0_4_;
                      auVar55._4_4_ = auVar227._4_4_ + auVar90._4_4_;
                      auVar55._8_4_ = auVar227._8_4_ + auVar90._8_4_;
                      auVar55._12_4_ = auVar227._12_4_ + auVar90._12_4_;
                      auVar135._0_4_ = auVar248._0_4_ * auVar76._0_4_;
                      auVar135._4_4_ = auVar248._4_4_ * auVar76._4_4_;
                      auVar135._8_4_ = auVar248._8_4_ * auVar76._8_4_;
                      auVar135._12_4_ = auVar248._12_4_ * auVar76._12_4_;
                      auVar53 = vfmsub231ps_fma(auVar135,auVar228,auVar55);
                      auVar56._0_4_ = auVar123._0_4_ * auVar55._0_4_;
                      auVar56._4_4_ = auVar123._4_4_ * auVar55._4_4_;
                      auVar56._8_4_ = auVar123._8_4_ * auVar55._8_4_;
                      auVar56._12_4_ = auVar123._12_4_ * auVar55._12_4_;
                      auVar90 = vfmsub231ps_fma(auVar56,auVar248,auVar103);
                      auVar104._0_4_ = auVar103._0_4_ * auVar228._0_4_;
                      auVar104._4_4_ = auVar103._4_4_ * auVar228._4_4_;
                      auVar104._8_4_ = auVar103._8_4_ * auVar228._8_4_;
                      auVar104._12_4_ = auVar103._12_4_ * auVar228._12_4_;
                      auVar133 = vfmsub231ps_fma(auVar104,auVar123,auVar76);
                      auVar77._0_4_ = fVar147 * auVar133._0_4_;
                      auVar77._4_4_ = fVar148 * auVar133._4_4_;
                      auVar77._8_4_ = fVar153 * auVar133._8_4_;
                      auVar77._12_4_ = fVar154 * auVar133._12_4_;
                      auVar90 = vfmadd231ps_fma(auVar77,auVar65,auVar90);
                      auVar126 = vfmadd231ps_fma(auVar90,auVar91,auVar53);
                      auVar166._0_4_ = auVar126._0_4_ + auVar124._0_4_ + auVar125._0_4_;
                      auVar166._4_4_ = auVar126._4_4_ + auVar124._4_4_ + auVar125._4_4_;
                      auVar166._8_4_ = auVar126._8_4_ + auVar124._8_4_ + auVar125._8_4_;
                      auVar166._12_4_ = auVar126._12_4_ + auVar124._12_4_ + auVar125._12_4_;
                      auVar90 = vminps_avx(auVar124,auVar125);
                      auVar53 = vminps_avx(auVar90,auVar126);
                      auVar90 = vandps_avx(auVar242,auVar166);
                      auVar105._0_4_ = auVar90._0_4_ * 1.1920929e-07;
                      auVar105._4_4_ = auVar90._4_4_ * 1.1920929e-07;
                      auVar105._8_4_ = auVar90._8_4_ * 1.1920929e-07;
                      auVar105._12_4_ = auVar90._12_4_ * 1.1920929e-07;
                      auVar113 = ZEXT1664(auVar105);
                      uVar30 = CONCAT44(auVar105._4_4_,auVar105._0_4_);
                      auVar136._0_8_ = uVar30 ^ 0x8000000080000000;
                      auVar136._8_4_ = -auVar105._8_4_;
                      auVar136._12_4_ = -auVar105._12_4_;
                      auVar53 = vcmpps_avx(auVar53,auVar136,5);
                      auVar133 = vmaxps_avx(auVar124,auVar125);
                      auVar133 = vmaxps_avx(auVar133,auVar126);
                      auVar133 = vcmpps_avx(auVar133,auVar105,2);
                      _local_38a8 = vorps_avx(auVar53,auVar133);
                      auVar53 = auVar112 & _local_38a8;
                      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar53[0xf]) {
                        auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        auVar237 = ZEXT1664(auVar112);
                        auVar258 = ZEXT1664(auVar112);
                        _local_38a8 = auVar227;
                      }
                      else {
                        in_ZMM13 = ZEXT1664(auVar13);
                        auVar57._0_4_ = fVar87 * auVar10._0_4_;
                        auVar57._4_4_ = fVar89 * auVar10._4_4_;
                        auVar57._8_4_ = fVar116 * auVar10._8_4_;
                        auVar57._12_4_ = fVar142 * auVar10._12_4_;
                        auVar78._0_4_ = fVar159 * auVar9._0_4_;
                        auVar78._4_4_ = fVar169 * auVar9._4_4_;
                        auVar78._8_4_ = fVar170 * auVar9._8_4_;
                        auVar78._12_4_ = fVar171 * auVar9._12_4_;
                        auVar227 = vfmsub213ps_fma(auVar9,auVar121,auVar57);
                        auVar106._0_4_ = auVar228._0_4_ * fVar70;
                        auVar106._4_4_ = auVar228._4_4_ * fVar88;
                        auVar106._8_4_ = auVar228._8_4_ * fVar115;
                        auVar106._12_4_ = auVar228._12_4_ * fVar141;
                        auVar137._0_4_ = fVar159 * auVar248._0_4_;
                        auVar137._4_4_ = fVar169 * auVar248._4_4_;
                        auVar137._8_4_ = fVar170 * auVar248._8_4_;
                        auVar137._12_4_ = fVar171 * auVar248._12_4_;
                        auVar248 = vfmsub213ps_fma(auVar248,auVar13,auVar106);
                        auVar53 = vandps_avx(auVar242,auVar57);
                        auVar133 = vandps_avx(auVar242,auVar106);
                        auVar53 = vcmpps_avx(auVar53,auVar133,1);
                        vVar6.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx(auVar248,auVar227,auVar53);
                        auVar246 = ZEXT1664((undefined1  [16])vVar6.field_0);
                        auVar58._0_4_ = auVar123._0_4_ * fVar87;
                        auVar58._4_4_ = auVar123._4_4_ * fVar89;
                        auVar58._8_4_ = auVar123._8_4_ * fVar116;
                        auVar58._12_4_ = auVar123._12_4_ * fVar142;
                        auVar227 = vfmsub213ps_fma(auVar123,auVar121,auVar137);
                        auVar107._0_4_ = local_37d8._0_4_ * fVar70;
                        auVar107._4_4_ = local_37d8._4_4_ * fVar88;
                        auVar107._8_4_ = local_37d8._8_4_ * fVar115;
                        auVar107._12_4_ = local_37d8._12_4_ * fVar141;
                        auVar248 = vfmsub213ps_fma(auVar10,auVar122,auVar107);
                        auVar53 = vandps_avx(auVar242,auVar107);
                        auVar133 = vandps_avx(auVar242,auVar137);
                        auVar53 = vcmpps_avx(auVar53,auVar133,1);
                        vVar7.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx(auVar227,auVar248,auVar53);
                        auVar227 = vfmsub213ps_fma(_local_37d8,auVar13,auVar78);
                        auVar228 = vfmsub213ps_fma(auVar228,auVar122,auVar58);
                        auVar53 = vandps_avx(auVar242,auVar78);
                        auVar133 = vandps_avx(auVar242,auVar58);
                        auVar53 = vcmpps_avx(auVar53,auVar133,1);
                        auVar133 = vblendvps_avx(auVar228,auVar227,auVar53);
                        local_38c8._0_4_ = auVar16._0_4_;
                        local_38c8._4_4_ = auVar16._4_4_;
                        fStack_38c0 = auVar16._8_4_;
                        auVar59._0_4_ = auVar133._0_4_ * (float)local_38c8._0_4_;
                        auVar59._4_4_ = auVar133._4_4_ * (float)local_38c8._4_4_;
                        auVar59._8_4_ = auVar133._8_4_ * fStack_38c0;
                        auVar59._12_4_ = auVar133._12_4_ * fVar154;
                        auVar65 = vfmadd213ps_fma(auVar65,(undefined1  [16])vVar7.field_0,auVar59);
                        auVar65 = vfmadd213ps_fma(auVar91,(undefined1  [16])vVar6.field_0,auVar65);
                        auVar60._0_4_ = auVar65._0_4_ + auVar65._0_4_;
                        auVar60._4_4_ = auVar65._4_4_ + auVar65._4_4_;
                        auVar60._8_4_ = auVar65._8_4_ + auVar65._8_4_;
                        auVar60._12_4_ = auVar65._12_4_ + auVar65._12_4_;
                        auVar79._0_4_ = auVar133._0_4_ * fVar38;
                        auVar79._4_4_ = auVar133._4_4_ * fVar67;
                        auVar79._8_4_ = auVar133._8_4_ * fVar68;
                        auVar79._12_4_ = auVar133._12_4_ * fVar69;
                        auVar65 = vfmadd213ps_fma(auVar173,(undefined1  [16])vVar7.field_0,auVar79);
                        auVar91 = vfmadd213ps_fma(auVar80,(undefined1  [16])vVar6.field_0,auVar65);
                        auVar65 = vrcpps_avx(auVar60);
                        auVar167._8_4_ = 0x3f800000;
                        auVar167._0_8_ = 0x3f8000003f800000;
                        auVar167._12_4_ = 0x3f800000;
                        auVar53 = vfnmadd213ps_fma(auVar65,auVar60,auVar167);
                        auVar65 = vfmadd132ps_fma(auVar53,auVar65,auVar65);
                        auVar138._0_4_ = (auVar91._0_4_ + auVar91._0_4_) * auVar65._0_4_;
                        auVar138._4_4_ = (auVar91._4_4_ + auVar91._4_4_) * auVar65._4_4_;
                        auVar138._8_4_ = (auVar91._8_4_ + auVar91._8_4_) * auVar65._8_4_;
                        auVar138._12_4_ = (auVar91._12_4_ + auVar91._12_4_) * auVar65._12_4_;
                        auVar65 = *(undefined1 (*) [16])(ray + 0x80);
                        auVar237 = ZEXT1664(auVar65);
                        auVar91 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar138,2);
                        auVar53 = vcmpps_avx(auVar138,auVar65,2);
                        auVar91 = vandps_avx(auVar91,auVar53);
                        uVar30 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
                        auVar108._0_8_ = uVar30 ^ 0x8000000080000000;
                        auVar108._8_4_ = -auVar60._8_4_;
                        auVar108._12_4_ = -auVar60._12_4_;
                        auVar113 = ZEXT1664(auVar108);
                        auVar53 = vcmpps_avx(auVar60,auVar108,4);
                        auVar91 = vandps_avx(auVar53,auVar91);
                        auVar53 = vandps_avx(auVar112,_local_38a8);
                        auVar91 = vpslld_avx(auVar91,0x1f);
                        auVar80 = vpsrad_avx(auVar91,0x1f);
                        auVar91 = auVar53 & auVar80;
                        auVar258 = ZEXT1664(auVar112);
                        if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar91[0xf]) {
                          auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                        CONCAT48(0x7f800000,0x7f8000007f800000)));
                        }
                        else {
                          auVar91 = vandps_avx(auVar80,auVar53);
                          pGVar3 = (context->scene->geometries).items
                                   [*(uint *)(lVar27 + 0x40 + uVar36 * 4)].ptr;
                          uVar21 = pGVar3->mask;
                          auVar81._4_4_ = uVar21;
                          auVar81._0_4_ = uVar21;
                          auVar81._8_4_ = uVar21;
                          auVar81._12_4_ = uVar21;
                          auVar53 = vpand_avx(auVar81,*(undefined1 (*) [16])(ray + 0x90));
                          auVar53 = vpcmpeqd_avx(auVar53,_DAT_01f7aa10);
                          auVar80 = auVar91 & ~auVar53;
                          auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                        CONCAT48(0x7f800000,0x7f8000007f800000)));
                          if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar80 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar80[0xf] < '\0') {
                            aVar84 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     vandnps_avx(auVar53,auVar91);
                            auVar113 = ZEXT1664((undefined1  [16])aVar84);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar91 = vrcpps_avx(auVar166);
                              auVar196._8_4_ = 0x3f800000;
                              auVar196._0_8_ = 0x3f8000003f800000;
                              auVar196._12_4_ = 0x3f800000;
                              auVar53 = vfnmadd213ps_fma(auVar166,auVar91,auVar196);
                              auVar53 = vfmadd132ps_fma(auVar53,auVar91,auVar91);
                              auVar63._8_4_ = 0x219392ef;
                              auVar63._0_8_ = 0x219392ef219392ef;
                              auVar63._12_4_ = 0x219392ef;
                              auVar91 = vcmpps_avx(auVar90,auVar63,5);
                              auVar91 = vandps_avx(auVar91,auVar53);
                              auVar82._0_4_ = auVar91._0_4_ * auVar124._0_4_;
                              auVar82._4_4_ = auVar91._4_4_ * auVar124._4_4_;
                              auVar82._8_4_ = auVar91._8_4_ * auVar124._8_4_;
                              auVar82._12_4_ = auVar91._12_4_ * auVar124._12_4_;
                              auVar90 = vminps_avx(auVar82,auVar196);
                              auVar64._0_4_ = auVar91._0_4_ * auVar125._0_4_;
                              auVar64._4_4_ = auVar91._4_4_ * auVar125._4_4_;
                              auVar64._8_4_ = auVar91._8_4_ * auVar125._8_4_;
                              auVar64._12_4_ = auVar91._12_4_ * auVar125._12_4_;
                              auVar91 = vminps_avx(auVar64,auVar196);
                              auVar53 = vsubps_avx(auVar196,auVar90);
                              auVar80 = vsubps_avx(auVar196,auVar91);
                              auVar14._8_8_ = uVar20;
                              auVar14._0_8_ = uVar19;
                              vblendvps_avx(auVar90,auVar53,auVar14);
                              auVar91 = vblendvps_avx(auVar91,auVar80,auVar14);
                              p0.field_0.field_0.x.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar6.field_0;
                              p0.field_0.field_0.y.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar7.field_0;
                              p0.field_0._32_16_ = auVar133;
                              vpcmpeqd_avx2(ZEXT1632(auVar91),ZEXT1632(auVar91));
                              auVar91 = vblendvps_avx(auVar65,auVar138,(undefined1  [16])aVar84);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar91;
                              itime.field_0 = aVar84;
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar3->userPtr;
                              p1.field_0._16_8_ = context->user;
                              p1.field_0._24_8_ = ray;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._40_4_ = 4;
                              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar246 = ZEXT1664((undefined1  [16])vVar6.field_0);
                                in_ZMM13 = ZEXT1664(auVar13);
                                auVar258._0_8_ =
                                     (*pGVar3->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1)
                                ;
                                auVar258._8_56_ = extraout_var_01;
                                auVar91 = auVar258._0_16_;
                                auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                auVar113 = ZEXT1664((undefined1  [16])itime.field_0);
                              }
                              auVar114 = auVar113._16_48_;
                              aVar84 = auVar113._0_16_;
                              if (aVar84 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                auVar91 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar91 = auVar91 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var5 = context->args->filter;
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar246 = ZEXT1664(auVar246._0_16_);
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  auVar66._0_8_ = (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                                  auVar66._8_56_ = extraout_var_02;
                                  auVar91 = auVar66._0_16_;
                                  auVar262 = ZEXT1664(CONCAT412(0x7f800000,
                                                                CONCAT48(0x7f800000,
                                                                         0x7f8000007f800000)));
                                  aVar84 = itime.field_0;
                                }
                                auVar90 = vpcmpeqd_avx((undefined1  [16])aVar84,_DAT_01f7aa10);
                                auVar91 = vpcmpeqd_avx(auVar91,auVar91);
                                auVar91 = auVar90 ^ auVar91;
                                auVar110._8_4_ = 0xff800000;
                                auVar110._0_8_ = 0xff800000ff800000;
                                auVar110._12_4_ = 0xff800000;
                                auVar114 = (undefined1  [48])0x0;
                                auVar90 = vblendvps_avx(auVar110,*(undefined1 (*) [16])
                                                                  (p1.field_0._24_8_ + 0x80),auVar90
                                                       );
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar90;
                              }
                              auVar91 = vpslld_avx(auVar91,0x1f);
                              auVar113._0_16_ = vpsrad_avx(auVar91,0x1f);
                              auVar113._16_48_ = auVar114;
                              auVar91 = vblendvps_avx(auVar65,*(undefined1 (*) [16])pRVar1,auVar91);
                              *(undefined1 (*) [16])pRVar1 = auVar91;
                            }
                            auVar237 = ZEXT1664(auVar65);
                            auVar112 = vpandn_avx(auVar113._0_16_,auVar112);
                            auVar258 = ZEXT1664(auVar112);
                          }
                        }
                      }
                      auVar112 = auVar258._0_16_;
                      if (((((auVar112 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                            (auVar112 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar112 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           -1 < auVar258[0xf]) || (bVar37 = 2 < uVar36, uVar36 = uVar36 + 1, bVar37)
                         ) break;
                    }
                    auVar65 = vandps_avx(auVar112,auVar238);
                    auVar238 = auVar238 & auVar112;
                  } while (((((auVar238 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar238 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar238 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar238[0xf] < '\0') &&
                          (uVar26 = uVar26 + 1, auVar238 = auVar65, uVar26 < uVar24 - 8));
                  auVar112 = vpcmpeqd_avx(auVar113._0_16_,auVar113._0_16_);
                  aVar85._0_4_ = auVar65._0_4_ ^ auVar112._0_4_;
                  aVar85._4_4_ = auVar65._4_4_ ^ auVar112._4_4_;
                  aVar85._8_4_ = auVar65._8_4_ ^ auVar112._8_4_;
                  aVar85._12_4_ = auVar65._12_4_ ^ auVar112._12_4_;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar85);
                auVar112 = auVar112 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar112 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar112 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar112[0xf]) goto LAB_005b1a7c;
                auVar111._8_4_ = 0xff800000;
                auVar111._0_8_ = 0xff800000ff800000;
                auVar111._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar111,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_005b01b4;
            }
            uVar24 = root.ptr & 0xfffffffffffffff0;
            auVar112 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar112,6);
            lVar27 = -0x20;
            sVar29 = 8;
            auVar65 = auVar262._0_16_;
            do {
              root.ptr = *(size_t *)(uVar24 + 0x40 + lVar27 * 2);
              if (root.ptr == 8) {
                auVar113 = ZEXT1664(auVar65);
                root.ptr = sVar29;
                break;
              }
              uVar22 = *(undefined4 *)(uVar24 + 0x120 + lVar27);
              auVar90._4_4_ = uVar22;
              auVar90._0_4_ = uVar22;
              auVar90._8_4_ = uVar22;
              auVar90._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x60 + lVar27);
              auVar160._4_4_ = uVar22;
              auVar160._0_4_ = uVar22;
              auVar160._8_4_ = uVar22;
              auVar160._12_4_ = uVar22;
              auVar91 = *(undefined1 (*) [16])(ray + 0x70);
              auVar90 = vfmadd231ps_fma(auVar160,auVar91,auVar90);
              uVar22 = *(undefined4 *)(uVar24 + 0x160 + lVar27);
              auVar121._4_4_ = uVar22;
              auVar121._0_4_ = uVar22;
              auVar121._8_4_ = uVar22;
              auVar121._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0xa0 + lVar27);
              auVar174._4_4_ = uVar22;
              auVar174._0_4_ = uVar22;
              auVar174._8_4_ = uVar22;
              auVar174._12_4_ = uVar22;
              auVar53 = vfmadd231ps_fma(auVar174,auVar91,auVar121);
              uVar22 = *(undefined4 *)(uVar24 + 0x1a0 + lVar27);
              auVar122._4_4_ = uVar22;
              auVar122._0_4_ = uVar22;
              auVar122._8_4_ = uVar22;
              auVar122._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0xe0 + lVar27);
              auVar188._4_4_ = uVar22;
              auVar188._0_4_ = uVar22;
              auVar188._8_4_ = uVar22;
              auVar188._12_4_ = uVar22;
              auVar133 = vfmadd231ps_fma(auVar188,auVar91,auVar122);
              uVar22 = *(undefined4 *)(uVar24 + 0x140 + lVar27);
              auVar123._4_4_ = uVar22;
              auVar123._0_4_ = uVar22;
              auVar123._8_4_ = uVar22;
              auVar123._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x80 + lVar27);
              auVar201._4_4_ = uVar22;
              auVar201._0_4_ = uVar22;
              auVar201._8_4_ = uVar22;
              auVar201._12_4_ = uVar22;
              auVar80 = vfmadd231ps_fma(auVar201,auVar91,auVar123);
              uVar22 = *(undefined4 *)(uVar24 + 0x180 + lVar27);
              auVar124._4_4_ = uVar22;
              auVar124._0_4_ = uVar22;
              auVar124._8_4_ = uVar22;
              auVar124._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0xc0 + lVar27);
              auVar215._4_4_ = uVar22;
              auVar215._0_4_ = uVar22;
              auVar215._8_4_ = uVar22;
              auVar215._12_4_ = uVar22;
              auVar173 = vfmadd231ps_fma(auVar215,auVar91,auVar124);
              uVar22 = *(undefined4 *)(uVar24 + 0x1c0 + lVar27);
              auVar125._4_4_ = uVar22;
              auVar125._0_4_ = uVar22;
              auVar125._8_4_ = uVar22;
              auVar125._12_4_ = uVar22;
              uVar22 = *(undefined4 *)(uVar24 + 0x100 + lVar27);
              auVar229._4_4_ = uVar22;
              auVar229._0_4_ = uVar22;
              auVar229._8_4_ = uVar22;
              auVar229._12_4_ = uVar22;
              auVar227 = vfmadd231ps_fma(auVar229,auVar91,auVar125);
              auVar9._8_8_ = tray.org.field_0._8_8_;
              auVar9._0_8_ = tray.org.field_0._0_8_;
              auVar10._8_8_ = tray.org.field_0._24_8_;
              auVar10._0_8_ = tray.org.field_0._16_8_;
              auVar13._8_8_ = tray.org.field_0._40_8_;
              auVar13._0_8_ = tray.org.field_0._32_8_;
              auVar246 = ZEXT1664(auVar13);
              auVar90 = vsubps_avx(auVar90,auVar9);
              auVar161._0_4_ = tray.rdir.field_0._0_4_ * auVar90._0_4_;
              auVar161._4_4_ = tray.rdir.field_0._4_4_ * auVar90._4_4_;
              auVar161._8_4_ = tray.rdir.field_0._8_4_ * auVar90._8_4_;
              auVar161._12_4_ = tray.rdir.field_0._12_4_ * auVar90._12_4_;
              auVar90 = vsubps_avx(auVar53,auVar10);
              in_ZMM13 = ZEXT1664((undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar175._0_4_ = tray.rdir.field_0._16_4_ * auVar90._0_4_;
              auVar175._4_4_ = tray.rdir.field_0._20_4_ * auVar90._4_4_;
              auVar175._8_4_ = tray.rdir.field_0._24_4_ * auVar90._8_4_;
              auVar175._12_4_ = tray.rdir.field_0._28_4_ * auVar90._12_4_;
              auVar90 = vsubps_avx(auVar133,auVar13);
              auVar189._0_4_ = tray.rdir.field_0._32_4_ * auVar90._0_4_;
              auVar189._4_4_ = tray.rdir.field_0._36_4_ * auVar90._4_4_;
              auVar189._8_4_ = tray.rdir.field_0._40_4_ * auVar90._8_4_;
              auVar189._12_4_ = tray.rdir.field_0._44_4_ * auVar90._12_4_;
              auVar90 = vsubps_avx(auVar80,auVar9);
              auVar202._0_4_ = tray.rdir.field_0._0_4_ * auVar90._0_4_;
              auVar202._4_4_ = tray.rdir.field_0._4_4_ * auVar90._4_4_;
              auVar202._8_4_ = tray.rdir.field_0._8_4_ * auVar90._8_4_;
              auVar202._12_4_ = tray.rdir.field_0._12_4_ * auVar90._12_4_;
              auVar90 = vsubps_avx(auVar173,auVar10);
              auVar216._0_4_ = tray.rdir.field_0._16_4_ * auVar90._0_4_;
              auVar216._4_4_ = tray.rdir.field_0._20_4_ * auVar90._4_4_;
              auVar216._8_4_ = tray.rdir.field_0._24_4_ * auVar90._8_4_;
              auVar216._12_4_ = tray.rdir.field_0._28_4_ * auVar90._12_4_;
              auVar90 = vsubps_avx(auVar227,auVar13);
              auVar230._0_4_ = tray.rdir.field_0._32_4_ * auVar90._0_4_;
              auVar230._4_4_ = tray.rdir.field_0._36_4_ * auVar90._4_4_;
              auVar230._8_4_ = tray.rdir.field_0._40_4_ * auVar90._8_4_;
              auVar230._12_4_ = tray.rdir.field_0._44_4_ * auVar90._12_4_;
              auVar237 = ZEXT1664(auVar230);
              auVar90 = vpminsd_avx(auVar161,auVar202);
              auVar53 = vpminsd_avx(auVar175,auVar216);
              auVar90 = vpmaxsd_avx(auVar90,auVar53);
              auVar53 = vpminsd_avx(auVar189,auVar230);
              auVar90 = vpmaxsd_avx(auVar90,auVar53);
              auVar126._0_4_ = auVar90._0_4_ * 0.99999964;
              auVar126._4_4_ = auVar90._4_4_ * 0.99999964;
              auVar126._8_4_ = auVar90._8_4_ * 0.99999964;
              auVar126._12_4_ = auVar90._12_4_ * 0.99999964;
              auVar90 = vpmaxsd_avx(auVar161,auVar202);
              auVar53 = vpmaxsd_avx(auVar175,auVar216);
              auVar53 = vpminsd_avx(auVar90,auVar53);
              auVar90 = vpmaxsd_avx(auVar189,auVar230);
              auVar53 = vpminsd_avx(auVar53,auVar90);
              auVar90 = vpmaxsd_avx(auVar126,(undefined1  [16])tray.tnear.field_0);
              auVar176._0_4_ = auVar53._0_4_ * 1.0000004;
              auVar176._4_4_ = auVar53._4_4_ * 1.0000004;
              auVar176._8_4_ = auVar53._8_4_ * 1.0000004;
              auVar176._12_4_ = auVar53._12_4_ * 1.0000004;
              auVar53 = vpminsd_avx(auVar176,(undefined1  [16])tray.tfar.field_0);
              if ((uVar21 & 7) == 6) {
                auVar90 = vcmpps_avx(auVar90,auVar53,2);
                uVar22 = *(undefined4 *)(uVar24 + 0x1e0 + lVar27);
                auVar177._4_4_ = uVar22;
                auVar177._0_4_ = uVar22;
                auVar177._8_4_ = uVar22;
                auVar177._12_4_ = uVar22;
                auVar53 = vcmpps_avx(auVar177,auVar91,2);
                uVar22 = *(undefined4 *)(uVar24 + 0x200 + lVar27);
                auVar190._4_4_ = uVar22;
                auVar190._0_4_ = uVar22;
                auVar190._8_4_ = uVar22;
                auVar190._12_4_ = uVar22;
                auVar91 = vcmpps_avx(auVar91,auVar190,1);
                auVar91 = vandps_avx(auVar53,auVar91);
                auVar91 = vandps_avx(auVar91,auVar90);
              }
              else {
                auVar91 = vcmpps_avx(auVar90,auVar53,2);
              }
              auVar91 = vandps_avx(auVar91,auVar112);
              auVar91 = vpslld_avx(auVar91,0x1f);
              if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar91[0xf]) {
                auVar113 = ZEXT1664(auVar65);
                root.ptr = sVar29;
              }
              else {
                auVar91 = vblendvps_avx(auVar262._0_16_,auVar126,auVar91);
                auVar113 = ZEXT1664(auVar91);
                if (sVar29 != 8) {
                  pNVar35->ptr = sVar29;
                  pNVar35 = pNVar35 + 1;
                  *(undefined1 (*) [16])paVar34->v = auVar65;
                  paVar34 = paVar34 + 1;
                }
              }
              auVar65 = auVar113._0_16_;
              lVar27 = lVar27 + 4;
              sVar29 = root.ptr;
            } while (lVar27 != 0);
            if (root.ptr == 8) goto LAB_005b0461;
            auVar112 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                  (undefined1  [16])auVar113._0_16_,6);
            uVar22 = vmovmskps_avx(auVar112);
          } while ((byte)uVar28 < (byte)POPCOUNT(uVar22));
          pNVar35->ptr = root.ptr;
          pNVar35 = pNVar35 + 1;
          *paVar34 = auVar113._0_16_;
          paVar34 = paVar34 + 1;
LAB_005b0461:
          iVar23 = 4;
        }
        else {
          do {
            sVar29 = 0;
            for (uVar26 = uVar24; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar29 = sVar29 + 1;
            }
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            bVar37 = occluded1(This,bvh,root,sVar29,&pre,ray,&tray,context);
            if (bVar37) {
              *(undefined4 *)(local_37d8 + sVar29 * 4 + -0x10) = 0xffffffff;
            }
            uVar24 = uVar24 - 1 & uVar24;
          } while (uVar24 != 0);
          auVar112 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar112[0xf] < '\0') {
            auVar112._8_4_ = 0xff800000;
            auVar112._0_8_ = 0xff800000ff800000;
            auVar112._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar112,
                               (undefined1  [16])terminated.field_0);
            iVar23 = 2;
          }
          auVar262 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if (uVar28 < uVar21) goto LAB_005b01f9;
        }
      } while (iVar23 != 3);
LAB_005b1a7c:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar86._8_4_ = 0xff800000;
      auVar86._0_8_ = 0xff800000ff800000;
      auVar86._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar86);
      *(undefined1 (*) [16])pRVar1 = auVar8;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }